

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

OpCode ByteCodeGenerator::GetStFldOpCode
                 (FuncInfo *funcInfo,bool isRoot,bool isLetDecl,bool isConstDecl,
                 bool isClassMemberInit,bool forceStrictModeForClassComputedPropertyName)

{
  OpCode OVar1;
  undefined3 in_register_00000081;
  
  OVar1 = InitClassMember;
  if (CONCAT31(in_register_00000081,isClassMemberInit) == 0) {
    if (!isConstDecl) {
      if (isLetDecl) {
        return isRoot + InitLetFld;
      }
      if (((forceStrictModeForClassComputedPropertyName |
           (funcInfo->byteCodeFunction->super_FunctionProxy).field_0x46) & 1U) == 0) {
        OVar1 = (ushort)isRoot * 2 + StFld;
      }
      else {
        OVar1 = (ushort)isRoot * 2 + StFldStrict;
      }
      return OVar1;
    }
    OVar1 = isRoot + InitConstFld;
  }
  return OVar1;
}

Assistant:

Js::OpCode ByteCodeGenerator::GetStFldOpCode(FuncInfo* funcInfo, bool isRoot, bool isLetDecl, bool isConstDecl, bool isClassMemberInit, bool forceStrictModeForClassComputedPropertyName)
{
    return GetStFldOpCode(funcInfo->GetIsStrictMode() || forceStrictModeForClassComputedPropertyName, isRoot, isLetDecl, isConstDecl, isClassMemberInit);
}